

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O2

Alignment * __thiscall
spoa::SisdAlignmentEngine::Convex
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,uint32_t sequence_len,
          Graph *graph,int32_t *score)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  AlignmentType AVar5;
  int32_t *piVar6;
  int32_t *piVar7;
  Implementation *pIVar8;
  Node *pNVar9;
  pointer ppEVar10;
  bool bVar11;
  bool bVar12;
  pointer ppNVar13;
  pointer ppEVar14;
  bool bVar15;
  iterator __begin6;
  pointer ppEVar16;
  uint uVar17;
  undefined4 in_register_00000014;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  pointer ppNVar24;
  long lVar25;
  int iVar26;
  pointer ppEVar27;
  ulong uVar28;
  uint64_t j;
  ulong uVar29;
  int iVar30;
  ulong uVar31;
  uint64_t j_2;
  int iVar32;
  int iVar33;
  ulong uVar34;
  ulong local_f8;
  ulong local_f0;
  uint local_d4;
  uint local_c4;
  int32_t *local_c0;
  uint local_b8;
  uint local_b4;
  pointer local_b0;
  int32_t *local_a8;
  Graph *local_a0;
  ulong local_98;
  Implementation *local_90;
  Node *local_88;
  int32_t *local_80;
  int32_t *local_78;
  ulong local_70;
  ulong local_68;
  int32_t *local_60;
  pointer local_58;
  ulong local_50;
  long local_48;
  pointer local_40;
  long local_38;
  
  local_50 = CONCAT44(in_register_00000014,sequence_len);
  AVar5 = (this->super_AlignmentEngine).type_;
  local_58 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_90 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
  ;
  uVar18 = (ulong)(sequence_len + 1);
  local_d4 = 0x80000400;
  if (AVar5 == kSW) {
    local_d4 = 0;
  }
  local_38 = 2 - uVar18;
  local_f0 = 0;
  local_c0 = (int32_t *)CONCAT44(local_c0._4_4_,AVar5);
  ppNVar13 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar31 = 0;
  while (ppNVar24 = ppNVar13, ppNVar24 != local_58) {
    local_88 = *ppNVar24;
    local_70 = *(ulong *)&(local_90->node_id_to_rank).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    local_b0 = (local_88->inedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    ppEVar16 = (local_88->inedges).
               super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl
               .super__Vector_impl_data._M_finish;
    if (local_b0 == ppEVar16) {
      uVar29 = 0;
    }
    else {
      uVar29 = (ulong)(*(int *)(local_70 + (ulong)(*local_b0)->tail->id * 4) + 1);
    }
    cVar1 = (this->super_AlignmentEngine).q_;
    cVar2 = (this->super_AlignmentEngine).c_;
    local_80 = local_90->F;
    local_78 = local_90->H;
    lVar22 = uVar29 * uVar18;
    lVar25 = local_88->code * uVar18 * 4 +
             *(long *)&(local_90->sequence_profile).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl;
    local_b8 = *(int *)(local_70 + (ulong)local_88->id * 4) + 1;
    local_48 = local_b8 * uVar18;
    local_a8 = local_90->O;
    cVar3 = (this->super_AlignmentEngine).g_;
    cVar4 = (this->super_AlignmentEngine).e_;
    for (uVar29 = 1; uVar29 < uVar18; uVar29 = uVar29 + 1) {
      iVar30 = local_78[lVar22 + uVar29] + (int)cVar3;
      iVar26 = local_80[lVar22 + uVar29] + (int)cVar4;
      if (iVar26 < iVar30) {
        iVar26 = iVar30;
      }
      local_80[local_48 + uVar29] = iVar26;
      iVar30 = local_78[lVar22 + uVar29] + (int)cVar1;
      iVar26 = local_a8[lVar22 + uVar29] + (int)cVar2;
      if (iVar26 < iVar30) {
        iVar26 = iVar30;
      }
      local_a8[local_48 + uVar29] = iVar26;
      local_78[local_48 + uVar29] = *(int *)(lVar25 + uVar29 * 4) + local_78[lVar22 + (uVar29 - 1)];
    }
    local_68 = (long)ppEVar16 - (long)local_b0 >> 3;
    for (uVar29 = 1; uVar29 < local_68; uVar29 = (ulong)((int)uVar29 + 1)) {
      cVar1 = (this->super_AlignmentEngine).g_;
      cVar2 = (this->super_AlignmentEngine).e_;
      cVar3 = (this->super_AlignmentEngine).q_;
      cVar4 = (this->super_AlignmentEngine).c_;
      lVar22 = (*(int *)(local_70 + (ulong)local_b0[uVar29]->tail->id * 4) + 1) * uVar18;
      for (uVar23 = 1; uVar23 < uVar18; uVar23 = uVar23 + 1) {
        iVar30 = local_78[lVar22 + uVar23] + (int)cVar1;
        iVar26 = local_80[lVar22 + uVar23] + (int)cVar2;
        if (iVar26 < iVar30) {
          iVar26 = iVar30;
        }
        if (iVar26 < local_80[local_48 + uVar23]) {
          iVar26 = local_80[local_48 + uVar23];
        }
        local_80[local_48 + uVar23] = iVar26;
        iVar30 = local_78[lVar22 + uVar23] + (int)cVar3;
        iVar26 = local_a8[lVar22 + uVar23] + (int)cVar4;
        if (iVar26 < iVar30) {
          iVar26 = iVar30;
        }
        if (iVar26 < local_a8[local_48 + uVar23]) {
          iVar26 = local_a8[local_48 + uVar23];
        }
        local_a8[local_48 + uVar23] = iVar26;
        iVar26 = *(int *)(lVar25 + uVar23 * 4) + local_78[lVar22 + (uVar23 - 1)];
        if (iVar26 < local_78[local_48 + uVar23]) {
          iVar26 = local_78[local_48 + uVar23];
        }
        local_78[local_48 + uVar23] = iVar26;
      }
    }
    cVar1 = (this->super_AlignmentEngine).g_;
    cVar2 = (this->super_AlignmentEngine).e_;
    cVar3 = (this->super_AlignmentEngine).q_;
    cVar4 = (this->super_AlignmentEngine).c_;
    piVar6 = local_90->E;
    piVar7 = local_90->Q;
    local_98 = uVar31;
    for (uVar29 = 1; uVar29 < uVar18; uVar29 = uVar29 + 1) {
      iVar30 = local_78[local_48 + (uVar29 - 1)] + (int)cVar1;
      iVar26 = piVar6[local_48 + (uVar29 - 1)] + (int)cVar2;
      if (iVar26 < iVar30) {
        iVar26 = iVar30;
      }
      piVar6[local_48 + uVar29] = iVar26;
      uVar21 = local_78[local_48 + (uVar29 - 1)] + (int)cVar3;
      uVar17 = piVar7[local_48 + (uVar29 - 1)] + (int)cVar4;
      if ((int)uVar17 < (int)uVar21) {
        uVar17 = uVar21;
      }
      piVar7[local_48 + uVar29] = uVar17;
      uVar21 = piVar6[local_48 + uVar29];
      if (piVar6[local_48 + uVar29] < local_80[local_48 + uVar29]) {
        uVar21 = local_80[local_48 + uVar29];
      }
      if ((int)uVar17 < local_a8[local_48 + uVar29]) {
        uVar17 = local_a8[local_48 + uVar29];
      }
      if ((int)uVar17 < (int)uVar21) {
        uVar17 = uVar21;
      }
      if ((int)uVar17 < local_78[local_48 + uVar29]) {
        uVar17 = local_78[local_48 + uVar29];
      }
      local_78[local_48 + uVar29] = uVar17;
      if (AVar5 == kOV) {
        if ((local_88->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (local_88->outedges).
            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
LAB_0011f5e6:
          if ((int)local_d4 < (int)uVar17) {
            uVar31 = uVar29 & 0xffffffff;
LAB_0011f5fc:
            local_d4 = uVar17;
            local_98 = (ulong)local_b8;
            local_f0 = uVar31;
          }
        }
      }
      else if (AVar5 == kNW) {
        if (((local_38 + uVar29 == 1) &&
            ((local_88->outedges).
             super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
             super__Vector_impl_data._M_start ==
             (local_88->outedges).
             super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>._M_impl.
             super__Vector_impl_data._M_finish)) &&
           (uVar31 = local_50, uVar17 = local_78[local_48 + (uVar18 - 1)],
           (int)local_d4 < local_78[local_48 + (uVar18 - 1)])) goto LAB_0011f5fc;
      }
      else if (AVar5 == kSW) {
        uVar17 = ~((int)uVar17 >> 0x1f) & uVar17;
        local_78[local_48 + uVar29] = uVar17;
        goto LAB_0011f5e6;
      }
    }
    uVar31 = local_98;
    local_40 = ppNVar24;
    ppNVar13 = ppNVar24 + 1;
  }
  if ((int)uVar31 == 0 && (int)local_f0 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    return __return_storage_ptr__;
  }
  if (score != (int32_t *)0x0) {
    *score = local_d4;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8 = 0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar29 = 0;
  local_a0 = graph;
  local_60 = score;
  do {
    iVar26 = (int)uVar31;
    uVar17 = (uint)local_f0;
    uVar23 = local_f0 & 0xffffffff;
    if (AVar5 == kOV) {
      uVar21 = uVar17;
      if (iVar26 == 0) goto LAB_0011fc75;
joined_r0x0011f6ca:
      if (uVar21 == 0) goto LAB_0011fc75;
    }
    else {
      if (AVar5 != kNW) {
        if (AVar5 == kSW) {
          uVar21 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                   _M_head_impl)->H[uVar31 * uVar18 + uVar23];
          goto joined_r0x0011f6ca;
        }
LAB_0011fc75:
        std::
        __reverse<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  ((__return_storage_ptr__->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                   (__return_storage_ptr__->
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
        return __return_storage_ptr__;
      }
      if (iVar26 == 0 && uVar17 == 0) goto LAB_0011fc75;
    }
    pIVar8 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    lVar22 = uVar31 * uVar18;
    piVar6 = pIVar8->H;
    local_c0 = piVar6 + lVar22;
    iVar30 = local_c0[uVar23];
    if ((uVar17 == 0) || (iVar26 == 0)) {
LAB_0011f7df:
      if (iVar26 != 0) {
        pNVar9 = (local_a0->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar26 - 1];
        ppEVar16 = (pNVar9->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar10 = *(pointer *)
                    ((long)&(pNVar9->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        if (ppEVar16 == ppEVar10) {
          uVar21 = 0;
        }
        else {
          uVar21 = *(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           + (ulong)(*ppEVar16)->tail->id * 4) + 1;
        }
        lVar25 = uVar21 * uVar18;
        bVar12 = true;
        iVar19 = (int)(this->super_AlignmentEngine).e_;
        local_b0 = ppEVar10;
        if (iVar30 != pIVar8->F[lVar25 + uVar23] + iVar19) {
          local_68 = CONCAT44(local_68._4_4_,iVar19);
          uVar20 = (uint)(this->super_AlignmentEngine).g_;
          local_70 = (ulong)uVar20;
          if (iVar30 == uVar20 + piVar6[lVar25 + uVar23]) {
            bVar12 = false;
          }
          else {
            local_a8 = pIVar8->O;
            iVar32 = (int)(this->super_AlignmentEngine).c_;
            local_78 = (int32_t *)CONCAT44(local_78._4_4_,iVar32);
            if (iVar30 != local_a8[lVar25 + uVar23] + iVar32) {
              iVar33 = (int)(this->super_AlignmentEngine).q_;
              if (iVar30 != piVar6[lVar25 + uVar23] + iVar33) {
                local_b0 = (pointer)(pIVar8->F + uVar23);
                local_80 = piVar6 + uVar23;
                local_a8 = local_a8 + uVar23;
                uVar28 = 1;
                do {
                  if ((ulong)((long)ppEVar10 - (long)ppEVar16 >> 3) <= uVar28) goto LAB_0011f7e7;
                  uVar21 = *(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                   + (ulong)ppEVar16[uVar28]->tail->id * 4) + 1;
                  lVar25 = uVar21 * uVar18;
                  if (iVar30 == *(int *)((long)local_b0 + lVar25 * 4) + iVar19) goto LAB_0011fc6d;
                  if (iVar30 == uVar20 + local_80[lVar25]) {
                    bVar12 = false;
                    goto LAB_0011fc6d;
                  }
                  if (iVar30 == local_a8[lVar25] + iVar32) goto LAB_0011fc6d;
                  uVar28 = (ulong)((int)uVar28 + 1);
                } while (iVar30 != local_80[lVar25] + iVar33);
                bVar12 = false;
LAB_0011fc6d:
                uVar29 = (ulong)uVar21;
                local_f8 = local_f0;
                goto LAB_0011f881;
              }
              uVar29 = (ulong)uVar21;
              local_f8 = local_f0;
              goto LAB_0011f7d0;
            }
          }
        }
        uVar29 = (ulong)uVar21;
        local_f8 = local_f0;
        goto LAB_0011f909;
      }
LAB_0011f7e7:
      if (uVar17 == 0) {
        bVar12 = false;
LAB_0011f881:
        bVar11 = false;
      }
      else {
        bVar15 = true;
        if (iVar30 != (int)(this->super_AlignmentEngine).e_ + pIVar8->E[lVar22 + (uVar23 - 1)]) {
          if (iVar30 == (int)(this->super_AlignmentEngine).g_ + local_c0[uVar23 - 1]) {
            bVar15 = false;
          }
          else if (iVar30 != (int)(this->super_AlignmentEngine).c_ +
                             pIVar8->Q[lVar22 + (uVar23 - 1)]) {
            bVar12 = false;
            bVar11 = false;
            bVar15 = false;
            if (iVar30 != local_c0[uVar23 - 1] + (int)(this->super_AlignmentEngine).q_)
            goto LAB_0011f944;
          }
        }
        bVar11 = bVar15;
        bVar12 = false;
        local_f8 = (ulong)(uVar17 - 1);
        uVar29 = uVar31;
      }
    }
    else {
      pNVar9 = (local_a0->rank_to_node_).
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl
               .super__Vector_impl_data._M_start[iVar26 - 1];
      ppEVar16 = (pNVar9->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar10 = *(pointer *)
                  ((long)&(pNVar9->inedges).
                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                          ._M_impl + 8);
      if (ppEVar16 == ppEVar10) {
        uVar21 = 0;
      }
      else {
        uVar21 = *(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                         + (ulong)(*ppEVar16)->tail->id * 4) + 1;
      }
      iVar19 = *(int *)(pNVar9->code * uVar18 * 4 +
                        *(long *)&(pIVar8->sequence_profile).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar23 * 4
                       );
      uVar28 = (ulong)(uVar17 - 1);
      if (iVar30 == piVar6[uVar21 * uVar18 + uVar28] + iVar19) {
        uVar29 = (ulong)uVar21;
        local_f8 = uVar28;
      }
      else {
        uVar34 = 1;
        do {
          if ((ulong)((long)ppEVar10 - (long)ppEVar16 >> 3) <= uVar34) goto LAB_0011f7df;
          ppEVar14 = ppEVar16 + uVar34;
          uVar34 = (ulong)((int)uVar34 + 1);
          uVar21 = *(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           + (ulong)(*ppEVar14)->tail->id * 4) + 1;
        } while (iVar30 != piVar6[uVar28 + uVar21 * uVar18] + iVar19);
        uVar29 = (ulong)uVar21;
        local_f8 = uVar28;
      }
LAB_0011f7d0:
      bVar12 = false;
LAB_0011f909:
      bVar11 = false;
    }
LAB_0011f944:
    uVar31 = uVar29;
    local_c4 = 0xffffffff;
    if (iVar26 != (int)uVar31) {
      local_c4 = (local_a0->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar26 - 1]->id;
    }
    local_b4 = uVar17 - 1;
    if (uVar17 == (uint)local_f8) {
      local_b4 = 0xffffffff;
    }
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int,unsigned_int>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,&local_c4,&local_b4);
    if (bVar11) {
      lVar22 = uVar31 * uVar18;
      uVar17 = (uint)local_f8;
      do {
        do {
          uVar17 = uVar17 - 1;
          local_f0 = (ulong)uVar17;
          local_c4 = 0xffffffff;
          local_b4 = uVar17;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int,unsigned_int>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     __return_storage_ptr__,(int *)&local_c4,&local_b4);
          pIVar8 = (this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                   _M_head_impl;
          piVar6 = pIVar8->E;
        } while ((int)(this->super_AlignmentEngine).e_ + piVar6[lVar22 + local_f0] ==
                 piVar6[lVar22 + local_f0 + 1]);
        piVar6 = pIVar8->Q;
      } while ((int)(this->super_AlignmentEngine).c_ + piVar6[lVar22 + local_f0] ==
               piVar6[lVar22 + local_f0 + 1]);
    }
    else {
      local_f0 = local_f8;
      if (bVar12) {
        uVar29 = local_f8 & 0xffffffff;
        do {
          lVar22 = uVar31 * uVar18;
          pNVar9 = (local_a0->rank_to_node_).
                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[(int)uVar31 - 1];
          pIVar8 = (this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                   _M_head_impl;
          ppEVar16 = (pNVar9->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar10 = *(pointer *)
                      ((long)&(pNVar9->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl + 8);
          ppEVar14 = ppEVar16;
          do {
            ppEVar27 = ppEVar14;
            if (ppEVar27 == ppEVar10) {
              goto LAB_0011fab5;
            }
            uVar31 = (ulong)(*(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     + (ulong)(*ppEVar27)->tail->id * 4) + 1);
          } while ((pIVar8->F[lVar22 + uVar29] !=
                    pIVar8->F[uVar31 * uVar18 + uVar29] + (int)(this->super_AlignmentEngine).e_) &&
                  (ppEVar14 = ppEVar27 + 1,
                  pIVar8->O[lVar22 + uVar29] !=
                  pIVar8->O[uVar31 * uVar18 + uVar29] + (int)(this->super_AlignmentEngine).c_));
LAB_0011fb11:
          local_c4 = 0xffffffff;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<unsigned_int&,int>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     __return_storage_ptr__,&pNVar9->id,(int *)&local_c4);
        } while ((ppEVar27 != ppEVar10) && ((int)uVar31 != 0));
      }
    }
    AVar5 = (this->super_AlignmentEngine).type_;
    uVar29 = uVar31;
  } while( true );
LAB_0011fab5:
  if (ppEVar16 == ppEVar10) {
    uVar31 = 0;
    goto LAB_0011fb11;
  }
  uVar31 = (ulong)(*(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           + (ulong)(*ppEVar16)->tail->id * 4) + 1);
  if ((pIVar8->F[lVar22 + uVar29] ==
       pIVar8->H[uVar31 * uVar18 + uVar29] + (int)(this->super_AlignmentEngine).g_) ||
     (ppEVar16 = ppEVar16 + 1,
     pIVar8->O[lVar22 + uVar29] ==
     pIVar8->H[uVar31 * uVar18 + uVar29] + (int)(this->super_AlignmentEngine).q_))
  goto LAB_0011fb11;
  goto LAB_0011fab5;
}

Assistant:

Alignment SisdAlignmentEngine::Convex(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
  std::uint64_t matrix_width = sequence_len + 1;
  const auto& rank_to_node = graph.rank_to_node();

  std::int32_t max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;
  std::uint32_t max_i = 0;
  std::uint32_t max_j = 0;
  auto update_max_score = [&max_score, &max_i, &max_j] (
      std::int32_t* H_row,
      std::uint32_t i,
      std::uint32_t j) -> void {
    if (max_score < H_row[j]) {
      max_score = H_row[j];
      max_i = i;
      max_j = j;
    }
    return;
  };

  // alignment
  for (const auto& it : rank_to_node) {
    const auto& char_profile =
        &(pimpl_->sequence_profile[it->code * matrix_width]);

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ? 0 :
        pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    std::int32_t* H_row = &(pimpl_->H[i * matrix_width]);
    std::int32_t* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    std::int32_t* F_row = &(pimpl_->F[i * matrix_width]);
    std::int32_t* F_pred_row = &(pimpl_->F[pred_i * matrix_width]);

    std::int32_t* O_row = &(pimpl_->O[i * matrix_width]);
    std::int32_t* O_pred_row = &(pimpl_->O[pred_i * matrix_width]);

    // update F, O and H
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      F_row[j] = std::max(H_pred_row[j] + g_, F_pred_row[j] + e_);
      O_row[j] = std::max(H_pred_row[j] + q_, O_pred_row[j] + c_);
      H_row[j] = H_pred_row[j - 1] + char_profile[j];
    }
    // check other predeccessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);
      F_pred_row = &(pimpl_->F[pred_i * matrix_width]);
      O_pred_row = &(pimpl_->O[pred_i * matrix_width]);

      for (std::uint64_t j = 1; j < matrix_width; ++j) {
        F_row[j] = std::max(
            F_row[j],
            std::max(
                H_pred_row[j] + g_,
                F_pred_row[j] + e_));
        O_row[j] = std::max(
            O_row[j],
            std::max(
                H_pred_row[j] + q_,
                O_pred_row[j] + c_));
        H_row[j] = std::max(H_row[j], H_pred_row[j - 1] + char_profile[j]);
      }
    }

    // update E, Q and H
    std::int32_t* E_row = &(pimpl_->E[i * matrix_width]);
    std::int32_t* Q_row = &(pimpl_->Q[i * matrix_width]);
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      E_row[j] = std::max(H_row[j - 1] + g_, E_row[j - 1] + e_);
      Q_row[j] = std::max(H_row[j - 1] + q_, Q_row[j - 1] + c_);
      H_row[j] = std::max(
        H_row[j],
        std::max(
            std::max(F_row[j], E_row[j]),
            std::max(O_row[j], Q_row[j])));

      if (type_ == AlignmentType::kSW) {
        H_row[j] = std::max(H_row[j], 0);
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kNW &&
          (it->outedges.empty() && j == matrix_width - 1)) {
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kOV && it->outedges.empty()) {
        update_max_score(H_row, i, j);
      }
    }
  }

  if (max_i == 0 && max_j == 0) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  // backtrack
  Alignment alignment;
  std::uint32_t i = max_i;
  std::uint32_t j = max_j;

  auto sw_condition = [this, &i, &j, &matrix_width] () -> bool {
    return (pimpl_->H[i * matrix_width + j] == 0) ? false : true;
  };
  auto nw_condition = [&i, &j] () -> bool {
    return (i == 0 && j == 0) ? false : true;
  };
  auto ov_condition = [&i, &j] () -> bool {
    return (i == 0 || j == 0) ? false : true;
  };

  std::uint32_t prev_i = 0;
  std::uint32_t prev_j = 0;

  while ((type_ == AlignmentType::kSW && sw_condition()) ||
         (type_ == AlignmentType::kNW && nw_condition()) ||
         (type_ == AlignmentType::kOV && ov_condition())) {
    auto H_ij = pimpl_->H[i * matrix_width + j];
    bool predecessor_found = false, extend_left = false, extend_up = false;

    if (i != 0 && j != 0) {
      const auto& it = rank_to_node[i - 1];
      std::int32_t match_cost =
        pimpl_->sequence_profile[it->code * matrix_width + j];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
        prev_i = pred_i;
        prev_j = j - 1;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
            prev_i = pred_i;
            prev_j = j - 1;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && i != 0) {
      const auto& it = rank_to_node[i - 1];

      std::uint32_t pred_i = it->inedges.empty() ? 0 :
        pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if ((extend_up |= H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||
                        H_ij == pimpl_->H[pred_i * matrix_width + j] + g_  ||
          (extend_up |= H_ij == pimpl_->O[pred_i * matrix_width + j] + c_) ||
                        H_ij == pimpl_->H[pred_i * matrix_width + j] + q_) {
        prev_i = pred_i;
        prev_j = j;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if ((extend_up |= H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||  // NOLINT
                            H_ij == pimpl_->H[pred_i * matrix_width + j] + g_  ||  // NOLINT
              (extend_up |= H_ij == pimpl_->O[pred_i * matrix_width + j] + c_) ||  // NOLINT
                            H_ij == pimpl_->H[pred_i * matrix_width + j] + q_) {
            prev_i = pred_i;
            prev_j = j;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && j != 0) {
      if ((extend_left |= H_ij == pimpl_->E[i * matrix_width + j - 1] + e_) ||
                          H_ij == pimpl_->H[i * matrix_width + j - 1] + g_  ||
          (extend_left |= H_ij == pimpl_->Q[i * matrix_width + j - 1] + c_) ||
                          H_ij == pimpl_->H[i * matrix_width + j - 1] + q_) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j - 1);

    i = prev_i;
    j = prev_j;

    if (extend_left) {
      while (true) {
        alignment.emplace_back(-1, j - 1);
        --j;
        if (pimpl_->E[i * matrix_width + j] + e_ != pimpl_->E[i * matrix_width + j + 1] &&  // NOLINT
            pimpl_->Q[i * matrix_width + j] + c_ != pimpl_->Q[i * matrix_width + j + 1]) {  // NOLINT
          break;
        }
      }
    } else if (extend_up) {
      while (true) {
        bool stop = true;
        prev_i = 0;
        for (const auto& it : rank_to_node[i - 1]->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;

          if (pimpl_->F[i * matrix_width + j] == pimpl_->F[pred_i * matrix_width + j] + e_ ||  // NOLINT
              pimpl_->O[i * matrix_width + j] == pimpl_->O[pred_i * matrix_width + j] + c_) {  // NOLINT
            prev_i = pred_i;
            stop = false;
            break;
          }
        }
        if (stop == true) {
          for (const auto& it : rank_to_node[i - 1]->inedges) {
            std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;

            if (pimpl_->F[i * matrix_width + j] == pimpl_->H[pred_i * matrix_width + j] + g_ ||  // NOLINT
                pimpl_->O[i * matrix_width + j] == pimpl_->H[pred_i * matrix_width + j] + q_) {  // NOLINT
              prev_i = pred_i;
              break;
            }
          }
        }

        alignment.emplace_back(rank_to_node[i - 1]->id, -1);
        i = prev_i;

        if (stop || i == 0) {
          break;
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
}